

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O2

double getPSNR(TRIPLEBYTES **mrx1,TRIPLEBYTES **mrx2,int y,int x,int h,int w,int component)

{
  byte bVar1;
  byte bVar2;
  int j;
  int j_00;
  int i;
  int i_00;
  double dVar3;
  undefined8 local_40;
  
  local_40 = 0.0;
  for (i_00 = y; j_00 = x, i_00 < h; i_00 = i_00 + 1) {
    for (; j_00 < w; j_00 = j_00 + 1) {
      bVar1 = getComponent(mrx1,i_00,j_00,component);
      bVar2 = getComponent(mrx2,i_00,j_00,component);
      local_40 = local_40 +
                 (double)(int)((uint)bVar1 - (uint)bVar2) * (double)(int)((uint)bVar1 - (uint)bVar2)
      ;
    }
  }
  dVar3 = log10(((double)((h - y) * (w - x)) * 65025.0) / local_40);
  return dVar3 * 10.0;
}

Assistant:

double getPSNR(TRIPLEBYTES **mrx1, TRIPLEBYTES **mrx2, int y, int x, int h, int w, int component) {
    double count = 0;
    for (int i = y; i < h; i++) {
        for (int j = x; j < w; j++) {
            count += pow(getComponent(mrx1, i, j, component) -
                         getComponent(mrx2, i, j, component), 2);
        }
    }
    return 10 * log10(((w - x) * (h - y) * pow(255, 2)) / count);
}